

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_30::DatagramPortImpl::send
          (DatagramPortImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  PromiseNode *pPVar1;
  DatagramPortImpl *pDVar2;
  int iVar3;
  SocketAddress *pSVar4;
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  Own<kj::_::ChainPromiseNode> OVar5;
  Fault f;
  Own<kj::_::PromiseNode> local_70;
  Own<kj::_::PromiseNode> local_60;
  DatagramPortImpl *local_50;
  undefined8 local_48;
  OwnedFileDescriptor OStack_40;
  
  local_50 = this;
  pSVar4 = NetworkAddressImpl::chooseOneAddress
                     ((NetworkAddressImpl *)CONCAT44(in_register_00000084,__flags));
  do {
    local_70.disposer =
         (Disposer *)
         sendto(*(int *)((_func_int **)CONCAT44(in_register_00000034,__fd) + 1),__buf,__n,0,
                (sockaddr *)&(pSVar4->addr).generic,pSVar4->addrlen);
    if (-1 < (long)local_70.disposer) {
      heap<kj::_::ImmediatePromiseNode<unsigned_long>,unsigned_long>
                ((kj *)&local_48,(unsigned_long *)&local_70);
      (local_50->super_DatagramPort)._vptr_DatagramPort = (_func_int **)local_48;
      local_50->super_OwnedFileDescriptor = OStack_40;
      return (ssize_t)local_50;
    }
    iVar3 = _::Debug::getOsErrorNumber(true);
  } while (iVar3 == -1);
  if (iVar3 == 0) {
    UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)&local_60);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    pDVar2 = local_50;
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_60,
               _::
               TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:1316:48),_kj::_::PropagateException>
               ::anon_class_32_4_857ca970_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0044d638;
    this_00[1].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)CONCAT44(in_register_00000034,__fd);
    this_00[1].dependency.disposer = (Disposer *)__buf;
    this_00[1].dependency.ptr = (PromiseNode *)__n;
    this_00[1].continuationTracePtr = (NetworkAddressImpl *)CONCAT44(in_register_00000084,__flags);
    local_70.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::DatagramPortImpl::send(void_const*,unsigned_long,kj::NetworkAddress&)::$_1,kj::_::PropagateException>>
          ::instance;
    local_70.ptr = (PromiseNode *)this_00;
    OVar5 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_48,&local_70);
    pPVar1 = local_70.ptr;
    *(undefined4 *)&(pDVar2->super_DatagramPort)._vptr_DatagramPort = (undefined4)local_48;
    *(undefined4 *)((long)&(pDVar2->super_DatagramPort)._vptr_DatagramPort + 4) = local_48._4_4_;
    (pDVar2->super_OwnedFileDescriptor).fd = OStack_40.fd;
    (pDVar2->super_OwnedFileDescriptor).flags = OStack_40.flags;
    if ((TransformPromiseNodeBase *)local_70.ptr != (TransformPromiseNodeBase *)0x0) {
      local_70.ptr = (PromiseNode *)0x0;
      (**(local_70.disposer)->_vptr_Disposer)
                (local_70.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode,OVar5.ptr);
    }
    pPVar1 = local_60.ptr;
    if (local_60.ptr != (PromiseNode *)0x0) {
      local_60.ptr = (PromiseNode *)0x0;
      (**((EventPort *)&(local_60.disposer)->_vptr_Disposer)->_vptr_EventPort)
                (local_60.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode)
      ;
    }
    return (ssize_t)pDVar2;
  }
  local_70.disposer = (Disposer *)0x0;
  local_48 = (PromiseFulfiller<void> *)0x0;
  OStack_40 = (OwnedFileDescriptor)0x0;
  _::Debug::Fault::init
            ((Fault *)&local_70,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
            );
  _::Debug::Fault::fatal((Fault *)&local_70);
}

Assistant:

Promise<size_t> DatagramPortImpl::send(
    const void* buffer, size_t size, NetworkAddress& destination) {
  auto& addr = downcast<NetworkAddressImpl>(destination).chooseOneAddress();

  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = sendto(fd, buffer, size, 0, addr.getRaw(), addr.getRawSize()));
  if (n < 0) {
    // Write buffer full.
    return observer.whenBecomesWritable().then([this, buffer, size, &destination]() {
      return send(buffer, size, destination);
    });
  } else {
    // If less than the whole message was sent, then it got truncated, and there's nothing we can
    // do about it.
    return n;
  }
}